

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::BeginViewportSideBar
               (char *name,ImGuiViewport *viewport_p,ImGuiDir dir,float axis_size,
               ImGuiWindowFlags window_flags)

{
  float fVar1;
  uint uVar2;
  ImGuiWindow *pIVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  ImRect avail_rect;
  ImVec2 pos;
  ImVec2 size;
  ImVec2 local_60;
  float afStack_58 [2];
  ImVec2 local_50;
  char *local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  if (dir == -1) {
    __assert_fail("dir != ImGuiDir_None",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui_widgets.cpp"
                  ,0x1adc,
                  "bool ImGui::BeginViewportSideBar(const char *, ImGuiViewport *, ImGuiDir, float, ImGuiWindowFlags)"
                 );
  }
  pIVar3 = FindWindowByName(name);
  if ((pIVar3 == (ImGuiWindow *)0x0) || (pIVar3->BeginCount == 0)) {
    if (viewport_p == (ImGuiViewport *)0x0) {
      viewport_p = GetMainViewport();
    }
    fVar5 = viewport_p[3].WorkPos.y;
    local_60.x = (viewport_p->Pos).x + fVar5;
    fVar1 = viewport_p[3].WorkSize.x;
    local_60.y = (viewport_p->Pos).y + fVar1;
    fVar6 = ((viewport_p->Size).x - fVar5) + viewport_p[3].WorkSize.y;
    fVar5 = ((viewport_p->Size).y - fVar1) + *(float *)&viewport_p[3].field_0x24;
    afStack_58[0] = (float)(~-(uint)(fVar6 <= 0.0) & (uint)fVar6) + local_60.x;
    afStack_58[1] = (float)(~-(uint)(fVar5 <= 0.0) & (uint)fVar5) + local_60.y;
    local_50.y = local_60.y;
    local_50.x = local_60.x;
    uVar2 = dir & 0xfffffffe;
    if ((dir | 2U) == 3) {
      (&local_50.x)[uVar2 == 2] = afStack_58[uVar2 == 2] - axis_size;
    }
    bVar4 = uVar2 == 2;
    local_40.y = afStack_58[1] - local_60.y;
    local_40.x = afStack_58[0] - local_60.x;
    (&local_40.x)[bVar4] = axis_size;
    local_38.x = 0.0;
    local_38.y = 0.0;
    local_48 = name;
    SetNextWindowPos(&local_50,0,&local_38);
    SetNextWindowSize(&local_40,0);
    name = local_48;
    if ((dir & 0xfffffffdU) == 0) {
      (&viewport_p[3].WorkPos.y)[bVar4] = axis_size + (&viewport_p[3].WorkPos.y)[bVar4];
    }
    else if ((dir | 2U) == 3) {
      (&viewport_p[3].WorkSize.y)[bVar4] = (&viewport_p[3].WorkSize.y)[bVar4] - axis_size;
    }
  }
  PushStyleVar(3,0.0);
  local_60.x = 0.0;
  local_60.y = 0.0;
  PushStyleVar(5,&local_60);
  bVar4 = Begin(name,(bool *)0x0,window_flags | 7);
  PopStyleVar(2);
  return bVar4;
}

Assistant:

bool ImGui::BeginViewportSideBar(const char* name, ImGuiViewport* viewport_p, ImGuiDir dir, float axis_size, ImGuiWindowFlags window_flags)
{
    IM_ASSERT(dir != ImGuiDir_None);

    ImGuiWindow* bar_window = FindWindowByName(name);
    if (bar_window == NULL || bar_window->BeginCount == 0)
    {
        // Calculate and set window size/position
        ImGuiViewportP* viewport = (ImGuiViewportP*)(void*)(viewport_p ? viewport_p : GetMainViewport());
        ImRect avail_rect = viewport->GetBuildWorkRect();
        ImGuiAxis axis = (dir == ImGuiDir_Up || dir == ImGuiDir_Down) ? ImGuiAxis_Y : ImGuiAxis_X;
        ImVec2 pos = avail_rect.Min;
        if (dir == ImGuiDir_Right || dir == ImGuiDir_Down)
            pos[axis] = avail_rect.Max[axis] - axis_size;
        ImVec2 size = avail_rect.GetSize();
        size[axis] = axis_size;
        SetNextWindowPos(pos);
        SetNextWindowSize(size);

        // Report our size into work area (for next frame) using actual window size
        if (dir == ImGuiDir_Up || dir == ImGuiDir_Left)
            viewport->BuildWorkOffsetMin[axis] += axis_size;
        else if (dir == ImGuiDir_Down || dir == ImGuiDir_Right)
            viewport->BuildWorkOffsetMax[axis] -= axis_size;
    }

    window_flags |= ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove;
    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowMinSize, ImVec2(0, 0)); // Lift normal size constraint
    bool is_open = Begin(name, NULL, window_flags);
    PopStyleVar(2);

    return is_open;
}